

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype __thiscall
QtPrivate::count(QtPrivate *this,QStringView haystack,QChar needle,CaseSensitivity cs)

{
  char16_t cVar1;
  char16_t cVar2;
  difference_type dVar3;
  undefined6 in_register_0000000a;
  QChar *__first;
  long lVar4;
  long in_FS_OFFSET;
  char16_t local_32;
  long local_30;
  
  __first = (QChar *)haystack.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_32 = (char16_t)haystack.m_data;
  if ((int)CONCAT62(in_register_0000000a,needle.ucs) == 1) {
    dVar3 = std::__count_if<QChar_const*,__gnu_cxx::__ops::_Iter_equals_val<QChar_const>>
                      (__first,__first + (long)this,(QChar *)&local_32);
  }
  else {
    cVar1 = foldCase(local_32);
    dVar3 = 0;
    for (lVar4 = 0; (long)this * 2 != lVar4; lVar4 = lVar4 + 2) {
      cVar2 = foldCase(*(char16_t *)((long)&__first->ucs + lVar4));
      dVar3 = dVar3 + (ulong)(cVar2 == cVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return dVar3;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QChar needle, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return std::count(haystack.cbegin(), haystack.cend(), needle);

    needle = foldCase(needle);
    return std::count_if(haystack.cbegin(), haystack.cend(),
                         [needle](const QChar c) { return foldAndCompare(c, needle); });
}